

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void PPRF_Eval(long msg)

{
  iterator iVar1;
  ostream *poVar2;
  mapped_type *ppuVar3;
  int j;
  long lVar4;
  key_type local_28;
  
  iVar1 = std::
          _Hashtable<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&keys._M_h,&local_28);
  if (iVar1.super__Node_iterator_base<std::pair<const_long,_unsigned_char_*>,_false>._M_cur ==
      (__node_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"stop at punctured point !",0x19);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Original pseudo random value of  ",0x21);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," is : ",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar4 = 0;
    do {
      ppuVar3 = std::__detail::
                _Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&keys,&local_28);
      printf("%02x ",(ulong)(*ppuVar3)[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return;
}

Assistant:

void PPRF_Eval(long msg ){
    if(keys.find(msg) == keys.end()){
        cout << "stop at punctured point !" << endl;
    }
    else{
        cout <<"Original pseudo random value of  "<< msg << " is : " << endl;
        for (int j = 0 ; j <16; ++j){
            printf ( "%02x ",keys[msg][j]);
        }
        cout << endl ;
    }
}